

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

void fs_event_cb_file_current_dir(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (fs_event_cb_called == 0) {
    fs_event_cb_called = 1;
    if (handle == &fs_event) {
      if (status == 0) {
        if (events == 2) {
          iVar1 = strcmp(filename,"watch_file");
          if (iVar1 == 0) {
            uv_timer_init(fs_event.loop,&fs_event_cb_file_current_dir::timer);
            fs_event_cb_file_current_dir::timer.data = &fs_event;
            uv_timer_start(&fs_event_cb_file_current_dir::timer,timer_cb_close_handle,0xfa,0);
            return;
          }
          pcVar3 = "strcmp(filename, \"watch_file\") == 0";
          uVar2 = 0x164;
        }
        else {
          pcVar3 = "events == UV_CHANGE";
          uVar2 = 0x162;
        }
      }
      else {
        pcVar3 = "status == 0";
        uVar2 = 0x161;
      }
    }
    else {
      pcVar3 = "handle == &fs_event";
      uVar2 = 0x160;
    }
  }
  else {
    pcVar3 = "fs_event_cb_called == 0";
    uVar2 = 0x15d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void fs_event_cb_file_current_dir(uv_fs_event_t* handle,
                                         const char* filename,
                                         int events,
                                         int status) {
  ASSERT(fs_event_cb_called == 0);
  ++fs_event_cb_called;
  ASSERT(status == 0);
#if defined(__APPLE__) || defined(__linux__)
  ASSERT(strcmp(filename, "watch_file") == 0);
#else
  ASSERT(filename == NULL || strcmp(filename, "watch_file") == 0);
#endif
  uv_close((uv_handle_t*)handle, NULL);
}